

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncOutputStream *adapterConstructorParams;
  _func_int *p_Var1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  TransformPromiseNodeBase *pTVar4;
  _func_int **pp_Var5;
  Disposer *in_RCX;
  PromiseNode *pPVar6;
  PromiseNode *extraout_RDX;
  Disposer *pDVar7;
  PromiseNode *pPVar8;
  Own<kj::_::PromiseNode> *this_00;
  PromiseNode *pPVar9;
  undefined1 *puVar10;
  Promise<unsigned_long> PVar11;
  Fault f;
  Own<kj::_::PromiseNode> local_c8;
  Own<kj::_::PromiseNode> local_b8;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_88;
  Disposer *local_78;
  Own<kj::_::PromiseNode> local_70;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  _func_int **local_40;
  PromiseNode *local_38;
  
  if (output[8]._vptr_AsyncOutputStream != (_func_int **)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x180,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&f);
  }
  adapterConstructorParams = output + 8;
  if (in_RCX < (Disposer *)output[5]._vptr_AsyncOutputStream) {
    (*(code *)**(undefined8 **)amount)(&local_b8,amount,output[4]._vptr_AsyncOutputStream);
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_b8,
               _::
               TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:389:19),_kj::_::PropagateException>
               ::anon_class_16_2_34952053_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430db8;
    pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    pTVar4[1].dependency.disposer = in_RCX;
    f.exception = (Exception *)
                  &_::
                   HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
                   ::instance;
    local_88.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_50.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_88.ptr = (PromiseNode *)0x0;
    local_50.ptr = (PromiseNode *)pTVar4;
    Own<kj::_::PromiseNode>::dispose(&local_88);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)this,(Canceler *)adapterConstructorParams,(Promise<unsigned_long> *)&local_50);
    Own<kj::_::PromiseNode>::dispose(&local_50);
    this_00 = &local_b8;
  }
  else {
    pPVar6 = (PromiseNode *)0x0;
    pDVar7 = (Disposer *)output[5]._vptr_AsyncOutputStream;
    for (pp_Var5 = output[6]._vptr_AsyncOutputStream + 1;
        (pPVar9 = (PromiseNode *)output[7]._vptr_AsyncOutputStream,
        (PromiseNode *)output[7]._vptr_AsyncOutputStream != pPVar6 &&
        (p_Var1 = *pp_Var5, pPVar9 = pPVar6, (Disposer *)(p_Var1 + (long)pDVar7) <= in_RCX));
        pp_Var5 = pp_Var5 + 2) {
      pPVar6 = (PromiseNode *)((long)&pPVar6->_vptr_PromiseNode + 1);
      pDVar7 = (Disposer *)(p_Var1 + (long)pDVar7);
    }
    (*(code *)**(undefined8 **)amount)(&promise,amount,output[4]._vptr_AsyncOutputStream);
    if (pPVar9 != (PromiseNode *)0x0) {
      pDVar2 = (Disposer *)output[6]._vptr_AsyncOutputStream;
      pTVar4 = (TransformPromiseNodeBase *)operator_new(0x40);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar4,(Own<kj::_::PromiseNode> *)&promise,
                 _::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:410:32),_kj::_::PropagateException>
                 ::anon_class_24_2_d8a1eacd_for_func::operator());
      (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430e40;
      pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
      pTVar4[1].dependency.disposer = pDVar2;
      pTVar4[1].dependency.ptr = pPVar9;
      f.exception = (Exception *)
                    &_::
                     HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
                     ::instance;
      _::maybeChain<void>(&local_b8,(Promise<void> *)&f);
      pPVar6 = local_b8.ptr;
      pDVar2 = local_b8.disposer;
      local_88.disposer = local_b8.disposer;
      local_b8.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_b8);
      local_c8.disposer = pDVar2;
      local_c8.ptr = pPVar6;
      local_88.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_88);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
      Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_c8);
      Own<kj::_::PromiseNode>::dispose(&local_c8);
    }
    pPVar6 = (PromiseNode *)output[7]._vptr_AsyncOutputStream;
    if (pPVar9 == pPVar6) {
      pTVar4 = (TransformPromiseNodeBase *)operator_new(0x48);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar4,(Own<kj::_::PromiseNode> *)&promise,
                 _::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:415:43),_kj::_::PropagateException>
                 ::anon_class_32_4_246a692a_for_func::operator());
      (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430ec8;
      pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar4[1].dependency.disposer = (Disposer *)amount;
      pTVar4[1].dependency.ptr = (PromiseNode *)in_RCX;
      pTVar4[1].continuationTracePtr = pDVar7;
      f.exception = (Exception *)
                    &_::
                     HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
                     ::instance;
      _::maybeChain<unsigned_long>(&local_b8,(Promise<unsigned_long> *)&f);
      pPVar6 = local_b8.ptr;
      local_88.disposer = local_b8.disposer;
      local_b8.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_b8);
      local_60.disposer = local_b8.disposer;
      local_60.ptr = pPVar6;
      local_88.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_88);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
      newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
                ((kj *)this,(Canceler *)adapterConstructorParams,(Promise<unsigned_long> *)&local_60
                );
      Own<kj::_::PromiseNode>::dispose(&local_60);
    }
    else {
      pPVar8 = (PromiseNode *)((long)in_RCX - (long)pDVar7);
      local_40 = output[6]._vptr_AsyncOutputStream;
      local_38 = (PromiseNode *)((long)local_40[(long)pPVar9 * 2 + 1] - (long)pPVar8);
      if ((PromiseNode *)local_40[(long)pPVar9 * 2 + 1] < pPVar8) {
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x1b0,FAILED,"n <= splitPiece.size()","");
        _::Debug::Fault::fatal(&f);
      }
      local_78 = (Disposer *)local_40[(long)pPVar9 * 2];
      if (in_RCX != pDVar7) {
        pTVar4 = (TransformPromiseNodeBase *)operator_new(0x40);
        _::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar4,(Own<kj::_::PromiseNode> *)&promise,
                   _::
                   TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:437:34),_kj::_::PropagateException>
                   ::anon_class_24_2_e72e484a_for_func::operator());
        (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430fd8;
        pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
        pTVar4[1].dependency.disposer = local_78;
        pTVar4[1].dependency.ptr = pPVar8;
        f.exception = (Exception *)
                      &_::
                       HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#4},kj::_::PropagateException>>
                       ::instance;
        _::maybeChain<void>(&local_b8,(Promise<void> *)&f);
        pPVar3 = local_b8.ptr;
        local_88.disposer = local_b8.disposer;
        local_b8.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode>::dispose(&local_b8);
        local_c8.disposer = local_b8.disposer;
        local_c8.ptr = pPVar3;
        local_88.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode>::dispose(&local_88);
        Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
        Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_c8);
        Own<kj::_::PromiseNode>::dispose(&local_c8);
      }
      pTVar4 = (TransformPromiseNodeBase *)operator_new(0x58);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar4,(Own<kj::_::PromiseNode> *)&promise,
                 _::
                 TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:442:43),_kj::_::PropagateException>
                 ::anon_class_48_4_354179c9_for_func::operator());
      puVar10 = (undefined1 *)((long)&pPVar9->_vptr_PromiseNode + 1);
      (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00431060;
      pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar4[1].dependency.disposer = (Disposer *)((long)local_78 + (long)pPVar8);
      pTVar4[1].dependency.ptr = local_38;
      pTVar4[1].continuationTracePtr = local_40 + (long)puVar10 * 2;
      pTVar4[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)((long)pPVar6 - (long)puVar10);
      pTVar4[2].dependency.disposer = in_RCX;
      f.exception = (Exception *)
                    &_::
                     HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#5},kj::_::PropagateException>>
                     ::instance;
      local_88.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#5},kj::_::PropagateException>>
            ::instance;
      local_70.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#5},kj::_::PropagateException>>
            ::instance;
      local_88.ptr = (PromiseNode *)0x0;
      local_70.ptr = (PromiseNode *)pTVar4;
      Own<kj::_::PromiseNode>::dispose(&local_88);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
      newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
                ((kj *)this,(Canceler *)adapterConstructorParams,(Promise<unsigned_long> *)&local_70
                );
      Own<kj::_::PromiseNode>::dispose(&local_70);
    }
    this_00 = (Own<kj::_::PromiseNode> *)&promise;
  }
  Own<kj::_::PromiseNode>::dispose(this_00);
  PVar11.super_PromiseBase.node.ptr = extraout_RDX;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar11.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      if (amount < writeBuffer.size()) {
        // Consume a portion of the write buffer.
        return canceler.wrap(output.write(writeBuffer.begin(), amount)
            .then([this,amount]() {
          writeBuffer = writeBuffer.slice(amount, writeBuffer.size());
          // We pumped the full amount, so we're done pumping.
          return amount;
        }));
      }

      // First piece doesn't cover the whole pump. Figure out how many more pieces to add.
      uint64_t actual = writeBuffer.size();
      size_t i = 0;
      while (i < morePieces.size() &&
             amount >= actual + morePieces[i].size()) {
        actual += morePieces[i++].size();
      }

      // Write the first piece.
      auto promise = output.write(writeBuffer.begin(), writeBuffer.size());

      // Write full pieces as a single gather-write.
      if (i > 0) {
        auto more = morePieces.slice(0, i);
        promise = promise.then([&output,more]() { return output.write(more); });
      }

      if (i == morePieces.size()) {
        // This will complete the write.
        return canceler.wrap(promise.then([this,&output,amount,actual]() -> Promise<uint64_t> {
          canceler.release();
          fulfiller.fulfill();
          pipe.endState(*this);

          if (actual == amount) {
            // Oh, we had exactly enough.
            return actual;
          } else {
            return pipe.pumpTo(output, amount - actual)
                .then([actual](uint64_t actual2) { return actual + actual2; });
          }
        }));
      } else {
        // Pump ends mid-piece. Write the last, partial piece.
        auto n = amount - actual;
        auto splitPiece = morePieces[i];
        KJ_ASSERT(n <= splitPiece.size());
        auto newWriteBuffer = splitPiece.slice(n, splitPiece.size());
        auto newMorePieces = morePieces.slice(i + 1, morePieces.size());
        auto prefix = splitPiece.slice(0, n);
        if (prefix.size() > 0) {
          promise = promise.then([&output,prefix]() {
            return output.write(prefix.begin(), prefix.size());
          });
        }

        return canceler.wrap(promise.then([this,newWriteBuffer,newMorePieces,amount]() {
          writeBuffer = newWriteBuffer;
          morePieces = newMorePieces;
          canceler.release();
          return amount;
        }));
      }
    }